

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

void __thiscall glslang::TProgram::TProgram(TProgram *this)

{
  TPoolAllocator *this_00;
  TInfoSink *this_01;
  list<glslang::TShader_*,_std::allocator<glslang::TShader_*>_> *local_20;
  int local_14;
  int s;
  TProgram *this_local;
  
  this->_vptr_TProgram = (_func_int **)&PTR__TProgram_013a9248;
  local_20 = this->stages;
  do {
    std::__cxx11::list<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>::list(local_20);
    local_20 = local_20 + 1;
  } while (local_20 !=
           (list<glslang::TShader_*,_std::allocator<glslang::TShader_*>_> *)this->intermediate);
  this->reflection = (TReflection *)0x0;
  this->linked = false;
  this_00 = (TPoolAllocator *)::operator_new(0x60);
  TPoolAllocator::TPoolAllocator(this_00,0x2000,0x10);
  this->pool = this_00;
  this_01 = (TInfoSink *)::operator_new(0x60);
  TInfoSink::TInfoSink(this_01);
  this->infoSink = this_01;
  for (local_14 = 0; local_14 < 0xe; local_14 = local_14 + 1) {
    this->intermediate[local_14] = (TIntermediate *)0x0;
    this->newedIntermediate[local_14] = false;
  }
  return;
}

Assistant:

TProgram::TProgram() : reflection(nullptr), linked(false)
{
    pool = new TPoolAllocator;
    infoSink = new TInfoSink;
    for (int s = 0; s < EShLangCount; ++s) {
        intermediate[s] = nullptr;
        newedIntermediate[s] = false;
    }
}